

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O3

void __thiscall
gui::ColorPicker::handleMousePress(ColorPicker *this,Button button,Vector2f *mouseParent)

{
  Widget *this_00;
  Transform *this_01;
  Vector2f *pVVar1;
  Vector2f VVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float local_48;
  float fStack_44;
  
  Group::handleMousePress(&this->super_Group,button,mouseParent);
  this_00 = &(this->super_Group).super_Container.super_Widget;
  this_01 = Widget::getInverseTransform(this_00);
  VVar2 = sf::Transform::transformPoint(this_01,mouseParent);
  pVVar1 = Widget::getOrigin(this_00);
  local_48 = VVar2.x;
  fStack_44 = VVar2.y;
  local_48 = local_48 - pVVar1->x;
  fVar4 = fStack_44 - pVVar1->y;
  VVar2 = getShadingRectangleSize(this);
  if ((((button == Left) && (this->isDragging_ == false)) && (local_48 < VVar2.x)) &&
     (fVar4 < VVar2.y)) {
    auVar3._4_4_ = 1.0 - fVar4 / VVar2.y;
    auVar3._0_4_ = local_48 / VVar2.x;
    auVar3._8_4_ = fStack_44;
    auVar3._12_4_ = 0;
    auVar3 = maxps(ZEXT816(0),auVar3);
    auVar3 = minps(_DAT_00213c90,auVar3);
    *(long *)((this->currentColorHsva_)._M_elems + 1) = auVar3._0_8_;
    updateCurrentColor(this,inputHsva,true,&this->currentColorHsva_);
    this->isDragging_ = true;
  }
  return;
}

Assistant:

void ColorPicker::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    const auto shadingRectangleSize = getShadingRectangleSize();
    if (button == sf::Mouse::Left && !isDragging_ && mouseLocal.x < shadingRectangleSize.x && mouseLocal.y < shadingRectangleSize.y) {
        GUI_DEBUG << "ColorPicker::handleMousePress().\n";
        updateShadingRectangle(mouseLocal.x / shadingRectangleSize.x, 1.0f - mouseLocal.y / shadingRectangleSize.y);
        isDragging_ = true;
    }
}